

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

int Cudd_VectorSupportSize(DdManager *dd,DdNode **F,int n)

{
  int *support;
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = dd->size;
  if (dd->size < dd->sizeZ) {
    uVar4 = dd->sizeZ;
  }
  support = (int *)malloc((long)(int)uVar4 << 2);
  if (support == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    iVar2 = -1;
  }
  else {
    uVar1 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar1;
    }
    for (; uVar5 != uVar1; uVar1 = uVar1 + 1) {
      support[uVar1] = 0;
    }
    uVar3 = 0;
    uVar1 = (ulong)(uint)n;
    if (n < 1) {
      uVar1 = uVar3;
    }
    for (; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      ddSupportStep((DdNode *)((ulong)F[uVar3] & 0xfffffffffffffffe),support);
    }
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      ddClearFlag((DdNode *)((ulong)F[uVar3] & 0xfffffffffffffffe));
    }
    iVar2 = 0;
    for (uVar1 = 0; uVar5 != uVar1; uVar1 = uVar1 + 1) {
      iVar2 = iVar2 + (uint)(support[uVar1] == 1);
    }
    free(support);
  }
  return iVar2;
}

Assistant:

int
Cudd_VectorSupportSize(
  DdManager * dd /* manager */,
  DdNode ** F /* array of DDs whose support is sought */,
  int  n /* size of the array */)
{
    int *support;
    int i;
    int size;
    int count;

    /* Allocate and initialize support array for ddSupportStep. */
    size = ddMax(dd->size, dd->sizeZ);
    support = ABC_ALLOC(int,size);
    if (support == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(CUDD_OUT_OF_MEM);
    }
    for (i = 0; i < size; i++) {
        support[i] = 0;
    }

    /* Compute support and clean up markers. */
    for (i = 0; i < n; i++) {
        ddSupportStep(Cudd_Regular(F[i]),support);
    }
    for (i = 0; i < n; i++) {
        ddClearFlag(Cudd_Regular(F[i]));
    }

    /* Count vriables in support. */
    count = 0;
    for (i = 0; i < size; i++) {
        if (support[i] == 1) count++;
    }

    ABC_FREE(support);
    return(count);

}